

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0
          (GridDataType0 *this,KUINT16 SampleType,KUINT8 *Data,KUINT16 NumBytes)

{
  ushort local_24;
  KUINT16 i;
  KUINT16 NumBytes_local;
  KUINT8 *Data_local;
  KUINT16 SampleType_local;
  GridDataType0 *this_local;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_0032e7d0;
  *(KUINT16 *)&(this->super_GridData).field_0xc = NumBytes;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8DataVals);
  this->m_ui8Padding = '\0';
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = 0;
  for (local_24 = 0; local_24 < *(ushort *)&(this->super_GridData).field_0xc;
      local_24 = local_24 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8DataVals,Data + local_24);
  }
  return;
}

Assistant:

GridDataType0::GridDataType0( KUINT16 SampleType, KUINT8 * Data, KUINT16 NumBytes ) :
    m_ui16NumBytes( NumBytes ),
    m_ui8Padding( 0 )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = Type0;

    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        m_vui8DataVals.push_back( Data[i] );
    }
}